

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csharp_field_base.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::csharp::FieldGeneratorBase::SetCommonOneofFieldVariables
          (FieldGeneratorBase *this,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *variables)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  mapped_type *pmVar3;
  long *plVar4;
  undefined8 *puVar5;
  ulong *puVar6;
  size_type *psVar7;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar8;
  FieldDescriptor *extraout_RDX;
  FieldDescriptor *extraout_RDX_00;
  FieldDescriptor *extraout_RDX_01;
  FieldDescriptor *extraout_RDX_02;
  FieldDescriptor *descriptor;
  ulong uVar9;
  undefined8 uVar10;
  string local_130;
  key_type local_110;
  string local_f0;
  string local_d0;
  ulong *local_b0;
  long local_a8;
  ulong local_a0;
  long lStack_98;
  key_type local_90;
  key_type local_70;
  string local_50;
  
  UnderscoresToCamelCase
            (&local_50,(string *)**(undefined8 **)(this->descriptor_ + 0x58),false,false);
  paVar1 = &local_70.field_2;
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"oneof_name","");
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](variables,&local_70);
  std::__cxx11::string::operator=((string *)pmVar3,(string *)&local_50);
  descriptor = extraout_RDX;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p);
    descriptor = extraout_RDX_00;
  }
  paVar2 = &local_50.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar2) {
    operator_delete(local_50._M_dataplus._M_p);
    descriptor = extraout_RDX_01;
  }
  paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)this->descriptor_;
  if (*(int *)(paVar8->_M_local_buf + 0x3c) != 3) {
    if (*(once_flag **)(paVar8->_M_local_buf + 0x30) != (once_flag *)0x0) {
      local_50._M_dataplus._M_p = (pointer)google::protobuf::FieldDescriptor::TypeOnceInit;
      local_70._M_dataplus._M_p = (pointer)paVar8;
      std::
      call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                (*(once_flag **)(paVar8->_M_local_buf + 0x30),
                 (_func_void_FieldDescriptor_ptr **)&local_50,(FieldDescriptor **)&local_70);
      descriptor = extraout_RDX_02;
    }
    if ((*(int *)(paVar8->_M_local_buf + 0x38) != 0xb) &&
       ((*(int *)(*(long *)(paVar8->_M_local_buf + 0x28) + 0x3c) == 2 ||
        (paVar8->_M_local_buf[0x41] == '\x01')))) {
      GetPropertyName_abi_cxx11_(&local_70,(csharp *)this->descriptor_,descriptor);
      puVar5 = (undefined8 *)std::__cxx11::string::replace((ulong)&local_70,0,(char *)0x0,0x2a17f9);
      psVar7 = puVar5 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar5 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar7) {
        local_50.field_2._M_allocated_capacity = *psVar7;
        local_50.field_2._8_4_ = *(undefined4 *)(puVar5 + 3);
        local_50.field_2._12_4_ = *(undefined4 *)((long)puVar5 + 0x1c);
        local_50._M_dataplus._M_p = (pointer)paVar2;
      }
      else {
        local_50.field_2._M_allocated_capacity = *psVar7;
        local_50._M_dataplus._M_p = (pointer)*puVar5;
      }
      local_50._M_string_length = puVar5[1];
      *puVar5 = psVar7;
      puVar5[1] = 0;
      *(undefined1 *)(puVar5 + 2) = 0;
      local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"has_property_check","");
      pmVar3 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](variables,&local_90);
      std::__cxx11::string::operator=((string *)pmVar3,(string *)&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != paVar2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != paVar1) {
        operator_delete(local_70._M_dataplus._M_p);
      }
      goto LAB_001f741d;
    }
  }
  UnderscoresToCamelCase
            (&local_130,(string *)**(undefined8 **)(this->descriptor_ + 0x58),false,false);
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_130);
  puVar6 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar6) {
    local_a0 = *puVar6;
    lStack_98 = plVar4[3];
    local_b0 = &local_a0;
  }
  else {
    local_a0 = *puVar6;
    local_b0 = (ulong *)*plVar4;
  }
  local_a8 = plVar4[1];
  *plVar4 = (long)puVar6;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  UnderscoresToCamelCase(&local_f0,(string *)**(undefined8 **)(this->descriptor_ + 0x58),true,false)
  ;
  uVar9 = 0xf;
  if (local_b0 != &local_a0) {
    uVar9 = local_a0;
  }
  if (uVar9 < local_f0._M_string_length + local_a8) {
    uVar10 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
      uVar10 = local_f0.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar10 < local_f0._M_string_length + local_a8) goto LAB_001f7169;
    puVar5 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_f0,0,(char *)0x0,(ulong)local_b0);
  }
  else {
LAB_001f7169:
    puVar5 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_b0,(ulong)local_f0._M_dataplus._M_p);
  }
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  psVar7 = puVar5 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar5 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar7) {
    local_90.field_2._M_allocated_capacity = *psVar7;
    local_90.field_2._8_8_ = puVar5[3];
  }
  else {
    local_90.field_2._M_allocated_capacity = *psVar7;
    local_90._M_dataplus._M_p = (pointer)*puVar5;
  }
  local_90._M_string_length = puVar5[1];
  *puVar5 = psVar7;
  puVar5[1] = 0;
  *(undefined1 *)psVar7 = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_90);
  paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(plVar4 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar4 == paVar8) {
    local_70.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
    local_70.field_2._8_8_ = plVar4[3];
    local_70._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_70.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
    local_70._M_dataplus._M_p = (pointer)*plVar4;
  }
  local_70._M_string_length = plVar4[1];
  *plVar4 = (long)paVar8;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  GetPropertyName_abi_cxx11_
            (&local_d0,(csharp *)this->descriptor_,(FieldDescriptor *)local_70._M_string_length);
  uVar10 = (FieldDescriptor *)0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    uVar10 = local_70.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar10 < (FieldDescriptor *)(local_70._M_string_length + local_d0._M_string_length)) {
    uVar10 = (FieldDescriptor *)0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      uVar10 = local_d0.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar10 < (FieldDescriptor *)(local_70._M_string_length + local_d0._M_string_length))
    goto LAB_001f72de;
    puVar5 = (undefined8 *)
             std::__cxx11::string::replace
                       ((ulong)&local_d0,0,(char *)0x0,(ulong)local_70._M_dataplus._M_p);
  }
  else {
LAB_001f72de:
    puVar5 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_70,(ulong)local_d0._M_dataplus._M_p);
  }
  psVar7 = puVar5 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar5 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar7) {
    local_50.field_2._M_allocated_capacity = *psVar7;
    local_50.field_2._8_4_ = *(undefined4 *)(puVar5 + 3);
    local_50.field_2._12_4_ = *(undefined4 *)((long)puVar5 + 0x1c);
    local_50._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_50.field_2._M_allocated_capacity = *psVar7;
    local_50._M_dataplus._M_p = (pointer)*puVar5;
  }
  local_50._M_string_length = puVar5[1];
  *puVar5 = psVar7;
  puVar5[1] = 0;
  *(undefined1 *)psVar7 = 0;
  local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"has_property_check","");
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](variables,&local_110);
  std::__cxx11::string::operator=((string *)pmVar3,(string *)&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_dataplus._M_p != &local_110.field_2) {
    operator_delete(local_110._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
    operator_delete(local_f0._M_dataplus._M_p);
  }
  if (local_b0 != &local_a0) {
    operator_delete(local_b0);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130._M_dataplus._M_p != &local_130.field_2) {
    operator_delete(local_130._M_dataplus._M_p);
  }
LAB_001f741d:
  UnderscoresToCamelCase(&local_50,(string *)**(undefined8 **)(this->descriptor_ + 0x58),true,false)
  ;
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"oneof_property_name","");
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](variables,&local_70);
  std::__cxx11::string::operator=((string *)pmVar3,(string *)&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  return;
}

Assistant:

void FieldGeneratorBase::SetCommonOneofFieldVariables(
    std::map<string, string>* variables) {
  (*variables)["oneof_name"] = oneof_name();
  if (SupportsPresenceApi(descriptor_)) {
    (*variables)["has_property_check"] = "Has" + property_name();
  } else {
    (*variables)["has_property_check"] =
      oneof_name() + "Case_ == " + oneof_property_name() +
      "OneofCase." + property_name();
  }
  (*variables)["oneof_property_name"] = oneof_property_name();
}